

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hwl.hpp
# Opt level: O1

bool hwl::space(state *ps)

{
  bool bVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined8 *local_98;
  undefined8 uStack_90;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  code *local_28 [2];
  
  local_78._8_8_ = &local_98;
  local_98 = &local_58;
  uStack_50 = 0;
  local_58 = 0x20;
  pcStack_40 = std::
               _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:593:10)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:593:10)>
             ::_M_manager;
  uStack_30 = 0;
  local_38 = 9;
  local_28[1] = std::
                _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:593:10)>
                ::_M_invoke;
  local_28[0] = std::
                _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:593:10)>
                ::_M_manager;
  uStack_90 = 2;
  pcStack_80 = std::
               _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:685:10)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:685:10)>
             ::_M_manager;
  local_78._M_unused._M_member_pointer = 0x16;
  pcStack_60 = std::
               _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:752:10)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:752:10)>
             ::_M_manager;
  bVar1 = std::
          _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:752:10)>
          ::_M_invoke(&local_78,ps);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,3);
  }
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,3);
  }
  lVar3 = -0x40;
  puVar2 = &local_38;
  do {
    if ((code *)puVar2[2] != (code *)0x0) {
      (*(code *)puVar2[2])(puVar2,puVar2,3);
    }
    puVar2 = puVar2 + -4;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  return bVar1;
}

Assistant:

bool space(parser::state& ps) {
		return parser::memoize(22, 
			parser::choice({
				parser::literal(' '),
				parser::literal('\t')}))(ps);
	}